

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSynth.c
# Opt level: O1

void Cec_SeqSynthesisSetDefaultParams(Cec_ParSeq_t *p)

{
  p->fUseLcorr = 0;
  p->fUseScorr = 0;
  p->nBTLimit = 0;
  p->nFrames = 0;
  p->nLevelMax = 0;
  p->fConsts = 0;
  p->fEquivs = 0;
  p->fUseMiniSat = 0;
  p->fUseMiniSat = 0;
  p->nMinDomSize = 0;
  p->fVeryVerbose = 0;
  p->fVerbose = 0;
  p->nBTLimit = 1000;
  p->nFrames = 1;
  p->nLevelMax = -1;
  p->fConsts = 1;
  p->fEquivs = 1;
  p->fUseMiniSat = 0;
  p->nMinDomSize = 100;
  p->fVeryVerbose = 0;
  p->fVerbose = 0;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Populate sequential synthesis parameters.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Cec_SeqSynthesisSetDefaultParams( Cec_ParSeq_t * p )
{
    memset( p, 0, sizeof(Cec_ParSeq_t) );
    p->fUseLcorr    =    0;  // enables latch correspondence
    p->fUseScorr    =    0;  // enables signal correspondence
    p->nBTLimit     = 1000;  // (scorr/lcorr) conflict limit at a node
    p->nFrames      =    1;  // (scorr only) the number of timeframes
    p->nLevelMax    =   -1;  // (scorr only) the max number of levels
    p->fConsts      =    1;  // (scl only) merging constants
    p->fEquivs      =    1;  // (scl only) merging equivalences
    p->fUseMiniSat  =    0;  // enables MiniSat in lcorr/scorr
    p->nMinDomSize  =  100;  // the size of minimum clock domain
    p->fVeryVerbose =    0;  // verbose stats
    p->fVerbose     =    0;  // verbose stats
}